

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O3

void sx_hash_xxh32_init(sx_hash_xxh32_t *state,uint32_t seed)

{
  *(undefined8 *)state = 0;
  *(uint32_t *)(state + 8) = seed + 0x24234428;
  *(uint32_t *)(state + 0xc) = seed + 0x85ebca77;
  *(uint32_t *)(state + 0x10) = seed;
  *(uint32_t *)(state + 0x14) = seed + 0x61c8864f;
  *(undefined8 *)(state + 0x18) = 0;
  *(undefined8 *)(state + 0x20) = 0;
  *(undefined4 *)(state + 0x28) = 0;
  return;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode XXH32_reset(XXH32_state_t* statePtr, unsigned int seed)
{
    XXH32_state_t state;   /* using a local state to memcpy() in order to avoid strict-aliasing warnings */
    memset(&state, 0, sizeof(state));
    state.v1 = seed + PRIME32_1 + PRIME32_2;
    state.v2 = seed + PRIME32_2;
    state.v3 = seed + 0;
    state.v4 = seed - PRIME32_1;
    /* do not write into reserved, planned to be removed in a future version */
    memcpy(statePtr, &state, sizeof(state) - sizeof(state.reserved));
    return XXH_OK;
}